

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 ImGui::ScrollToBringRectIntoView(ImGuiWindow *window,ImRect *item_rect)

{
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  float fVar4;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  float fVar5;
  ImRect window_rect;
  ImRect local_48;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  ImRect local_28;
  
  pIVar2 = GImGui;
  local_48.Min.x = (window->InnerRect).Min.x + -1.0;
  local_48.Min.y = (window->InnerRect).Min.y + -1.0;
  local_48.Max.x = (window->InnerRect).Max.x + 1.0;
  local_48.Max.y = (window->InnerRect).Max.y + 1.0;
  bVar3 = ImRect::Contains(&local_48,item_rect);
  local_38 = 0.0;
  fStack_34 = 0.0;
  fStack_30 = 0.0;
  fStack_2c = 0.0;
  if (bVar3) goto LAB_002d6308;
  if (window->ScrollbarX == true) {
    fVar4 = (item_rect->Min).x;
    fVar5 = 0.0;
    if (local_48.Min.x <= fVar4) {
      fVar4 = (item_rect->Max).x;
      if (fVar4 < local_48.Max.x) goto LAB_002d62a3;
      fVar5 = 1.0;
    }
    (window->ScrollTarget).x =
         (float)(int)((fVar4 - (window->Pos).x) + (pIVar2->Style).ItemSpacing.x + (window->Scroll).x
                     );
    (window->ScrollTargetCenterRatio).x = fVar5;
  }
LAB_002d62a3:
  fVar4 = (item_rect->Min).y;
  if (local_48.Min.y <= fVar4) {
    fVar4 = (item_rect->Max).y;
    if (local_48.Max.y <= fVar4) {
      fVar4 = (fVar4 - (window->Pos).y) + (pIVar2->Style).ItemSpacing.y;
      fVar5 = 1.0;
      goto LAB_002d62ea;
    }
  }
  else {
    fVar4 = (fVar4 - (window->Pos).y) - (pIVar2->Style).ItemSpacing.y;
    fVar5 = 0.0;
LAB_002d62ea:
    SetScrollFromPosY(window,fVar4,fVar5);
  }
  IVar1 = CalcNextScrollFromScrollTargetAndClamp(window,false);
  local_38 = IVar1.x - (window->Scroll).x;
  fStack_34 = IVar1.y - (window->Scroll).y;
  fStack_30 = extraout_XMM0_Dc - 0.0;
  fStack_2c = extraout_XMM0_Dd - 0.0;
LAB_002d6308:
  if ((window->Flags & 0x1000000) != 0) {
    local_28.Min.x = (item_rect->Min).x - local_38;
    local_28.Min.y = (item_rect->Min).y - fStack_34;
    local_28.Max.x = (item_rect->Max).x - local_38;
    local_28.Max.y = (item_rect->Max).y - fStack_34;
    IVar1 = ScrollToBringRectIntoView(window->ParentWindow,&local_28);
    local_38 = local_38 + IVar1.x;
    fStack_34 = fStack_34 + IVar1.y;
  }
  IVar1.y = fStack_34;
  IVar1.x = local_38;
  return IVar1;
}

Assistant:

ImVec2 ImGui::ScrollToBringRectIntoView(ImGuiWindow* window, const ImRect& item_rect)
{
    ImGuiContext& g = *GImGui;
    ImRect window_rect(window->InnerRect.Min - ImVec2(1, 1), window->InnerRect.Max + ImVec2(1, 1));
    //GetForegroundDrawList(window)->AddRect(window_rect.Min, window_rect.Max, IM_COL32_WHITE); // [DEBUG]

    ImVec2 delta_scroll;
    if (!window_rect.Contains(item_rect))
    {
        if (window->ScrollbarX && item_rect.Min.x < window_rect.Min.x)
            SetScrollFromPosX(window, item_rect.Min.x - window->Pos.x + g.Style.ItemSpacing.x, 0.0f);
        else if (window->ScrollbarX && item_rect.Max.x >= window_rect.Max.x)
            SetScrollFromPosX(window, item_rect.Max.x - window->Pos.x + g.Style.ItemSpacing.x, 1.0f);
        if (item_rect.Min.y < window_rect.Min.y)
            SetScrollFromPosY(window, item_rect.Min.y - window->Pos.y - g.Style.ItemSpacing.y, 0.0f);
        else if (item_rect.Max.y >= window_rect.Max.y)
            SetScrollFromPosY(window, item_rect.Max.y - window->Pos.y + g.Style.ItemSpacing.y, 1.0f);

        ImVec2 next_scroll = CalcNextScrollFromScrollTargetAndClamp(window, false);
        delta_scroll = next_scroll - window->Scroll;
    }

    // Also scroll parent window to keep us into view if necessary
    if (window->Flags & ImGuiWindowFlags_ChildWindow)
        delta_scroll += ScrollToBringRectIntoView(window->ParentWindow, ImRect(item_rect.Min - delta_scroll, item_rect.Max - delta_scroll));

    return delta_scroll;
}